

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgDmaStart(uchar *mem,uint count)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  if ((((byte)ZvgIO.ecpFlags & 1) == 0) && (uVar1 = zvgSetEcpMode(), uVar1 != 0)) {
    return uVar1;
  }
  if (count == 0) {
    uVar1 = 0;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = zvgEcpPutc(mem[lVar3]);
      if (uVar1 != 0) break;
      iVar2 = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (count - 1 != iVar2);
    if (uVar1 == 0x15) {
      ZvgIO.ecpFlags._0_1_ = (byte)ZvgIO.ecpFlags & 0xfc;
      ZvgIO.ecpDcrState = '\f';
      out((undefined2)ZvgIO.ecpDcr,0xc);
      uVar1 = 0x15;
    }
  }
  return uVar1;
}

Assistant:

static uint zvgDmaStart( uchar *mem, uint count)
{
	uint	err;

	// make sure we're in the ECP mode

	if (!(ZvgIO.ecpFlags & ECPF_ECP))
	{	err = zvgSetEcpMode();										// set to ECP mode

		if (err)
			return (err);												// if error, return
	}

	err = errOk;

	// loop through buffer sending bytes to the ZVG

	while (!err && count > 0)
	{	err = zvgEcpPutc( *mem);
		mem++;
		count--;
	}
	if (err == errEcpTimeout)
		compatibility();												// if timeout, force compatibility mode

	return (err);
}